

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::log<char_const(&)[37],char,char_const&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [37],
               char *params_1,char *params_2)

{
  char cVar1;
  long lVar2;
  undefined8 uVar3;
  undefined4 in_register_00000014;
  long lVar4;
  String *result;
  ArrayPtr<kj::String> in_stack_ffffffffffffff88;
  char *pcStack_68;
  String local_60;
  String local_48;
  
  str<char_const(&)[37]>
            ((String *)&stack0xffffffffffffff88,(kj *)params,
             (char (*) [37])CONCAT44(in_register_00000014,severity));
  cVar1 = *params_1;
  heapString(&local_60,1);
  if ((char *)local_60.content.size_ != (char *)0x0) {
    local_60.content.size_ = (size_t)local_60.content.ptr;
  }
  *(char *)local_60.content.size_ = cVar1;
  cVar1 = *params_2;
  heapString(&local_48,1);
  if ((char *)local_48.content.size_ != (char *)0x0) {
    local_48.content.size_ = (size_t)local_48.content.ptr;
  }
  *(char *)local_48.content.size_ = cVar1;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffff88,in_stack_ffffffffffffff88);
  lVar4 = 0x30;
  do {
    lVar2 = *(long *)(&stack0xffffffffffffff88 + lVar4);
    if (lVar2 != 0) {
      uVar3 = *(undefined8 *)(&stack0xffffffffffffff90 + lVar4);
      *(undefined8 *)(&stack0xffffffffffffff88 + lVar4) = 0;
      *(undefined8 *)(&stack0xffffffffffffff90 + lVar4) = 0;
      (**(code **)**(undefined8 **)((long)&pcStack_68 + lVar4))
                (*(undefined8 **)((long)&pcStack_68 + lVar4),lVar2,1,uVar3,uVar3,0);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}